

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

void __thiscall raft_functional_common::TestSm::free_user_snp_ctx(TestSm *this,void **user_snp_ctx)

{
  long *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> ll;
  int ctx;
  set<void_*,_std::less<void_*>,_std::allocator<void_*>_> *in_stack_ffffffffffffffd0;
  
  if (*in_RSI != 0) {
    free((void *)*in_RSI);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffffd0,in_RDI);
    std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::erase
              (in_stack_ffffffffffffffd0,(key_type *)in_RDI);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a63ad);
  }
  return;
}

Assistant:

void free_user_snp_ctx(void*& user_snp_ctx) {
        if (!user_snp_ctx) return;

        int ctx = 0;
        memcpy(&ctx, user_snp_ctx, sizeof(ctx));
        // Check magic number.
        assert(ctx == 0xabcdef);
        free(user_snp_ctx);

        std::lock_guard<std::mutex> ll(openedUserCtxsLock);
        openedUserCtxs.erase(user_snp_ctx);
    }